

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeAddOp3(Vdbe *p,int op,int p1,int p2,int p3)

{
  int iVar1;
  Op *pOVar2;
  int iVar3;
  
  iVar1 = p->nOp;
  iVar3 = iVar1;
  if (p->nOpAlloc <= iVar1) {
    iVar3 = growOpArray(p);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = p->nOp;
  }
  p->nOp = iVar3 + 1;
  pOVar2 = p->aOp;
  pOVar2[iVar1].opcode = (u8)op;
  pOVar2[iVar1].p5 = '\0';
  pOVar2[iVar1].p1 = p1;
  pOVar2[iVar1].p2 = p2;
  pOVar2[iVar1].p3 = p3;
  pOVar2[iVar1].p4.p = (void *)0x0;
  pOVar2[iVar1].p4type = '\0';
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOp3(Vdbe *p, int op, int p1, int p2, int p3){
  int i;
  VdbeOp *pOp;

  i = p->nOp;
  assert( p->magic==VDBE_MAGIC_INIT );
  assert( op>0 && op<0xff );
  if( p->nOpAlloc<=i ){
    if( growOpArray(p) ){
      return 1;
    }
  }
  p->nOp++;
  pOp = &p->aOp[i];
  pOp->opcode = (u8)op;
  pOp->p5 = 0;
  pOp->p1 = p1;
  pOp->p2 = p2;
  pOp->p3 = p3;
  pOp->p4.p = 0;
  pOp->p4type = P4_NOTUSED;
#ifdef SQLITE_DEBUG
  pOp->zComment = 0;
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    sqlite3VdbePrintOp(0, i, &p->aOp[i]);
  }
#endif
#ifdef VDBE_PROFILE
  pOp->cycles = 0;
  pOp->cnt = 0;
#endif
  return i;
}